

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O1

void Z80::OpCode_JR(void)

{
  bool bVar1;
  char cVar2;
  Z80Cond ZVar3;
  int iVar4;
  aint *in_RSI;
  char **in_RDI;
  aint jrad;
  char el [2048];
  uint local_84c;
  Z80Cond local_848;
  uint uStack_844;
  undefined4 uStack_840;
  undefined4 uStack_83c;
  char local_838 [2056];
  
  do {
    local_848 = ~Z80C_NZ;
    uStack_844 = 0xffffffff;
    uStack_840 = 0xffffffff;
    uStack_83c = 0xffffffff;
    ZVar3 = getz80cond(in_RDI);
    if (ZVar3 == Z80C_UNK) {
      local_848 = Z80C_C;
    }
    else {
      if (Z80C_C < ZVar3) {
        Error("[JR] Illegal condition",bp,PASS3);
        SkipToEol(&lp);
        Relocation::isResultAffected = 0;
        return;
      }
      bVar1 = comma(&lp);
      if (bVar1) {
        local_848 = ZVar3 | Z80C_PO;
      }
      else {
        in_RSI = (aint *)bp;
        Error("[JR cc] Comma expected",bp,PASS3);
      }
    }
    local_84c = 0;
    iVar4 = GetAddress((char **)&local_84c,in_RSI);
    if (iVar4 != 0) {
      local_84c = (local_84c - CurAddress) - 2;
    }
    if ((int)(char)local_84c != local_84c) {
      snprintf(local_838,0x800,"[JR] Target out of range (%+i)");
      Error(local_838,(char *)0x0,PASS3);
      local_84c = 0;
    }
    uStack_844 = local_84c & 0xff;
    in_RSI = (aint *)0x1;
    EmitBytes((int *)&local_848,true);
    in_RDI = &lp;
    cVar2 = (*DAT_0018d520)();
  } while (cVar2 != '\0');
  Relocation::isResultAffected = 0;
  return;
}

Assistant:

static void OpCode_JR() {
		do {
			int e[] { -1, -1, -1, -1 };
			Z80Cond cc = getz80cond(lp);
			if (Z80C_UNK == cc) e[0] = 0x18;
			else if (cc <= Z80C_C) {
				if (comma(lp)) e[0] = 0x20 + cc;
				else Error("[JR cc] Comma expected", bp);
			} else {
				Error("[JR] Illegal condition", bp);
				SkipToEol(lp);
				break;
			}
			aint jrad=0;
			if (GetAddress(lp, jrad)) jrad -= CurAddress + 2;
			if (jrad < -128 || jrad > 127) {
				char el[LINEMAX];
				SPRINTF1(el, LINEMAX, "[JR] Target out of range (%+i)", jrad);
				Error(el);
				jrad = 0;
			}
			e[1] = jrad & 0xFF;
			EmitBytes(e, true);
		} while (Options::syx.MultiArg(lp));
		Relocation::isResultAffected = false;	// relative jump is always relocatable
	}